

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O0

int Pf_CutComputeTruth6(Pf_Man_t *p,Pf_Cut_t *pCut0,Pf_Cut_t *pCut1,int fCompl0,int fCompl1,
                       Pf_Cut_t *pCutR,int fIsXor)

{
  Vec_Mem_t *pVVar1;
  int iVar2;
  uint uVar3;
  word *pwVar4;
  word wVar5;
  word wVar6;
  ulong local_70;
  word local_58;
  word t1;
  word t0;
  word t;
  int local_38;
  int fCompl;
  int truthId;
  int nOldSupp;
  Pf_Cut_t *pCutR_local;
  int fCompl1_local;
  int fCompl0_local;
  Pf_Cut_t *pCut1_local;
  Pf_Cut_t *pCut0_local;
  Pf_Man_t *p_local;
  
  fCompl = *(uint *)&pCutR->field_0x10 >> 0x1b;
  pVVar1 = p->vTtMem;
  _truthId = pCutR;
  pCutR_local._0_4_ = fCompl1;
  pCutR_local._4_4_ = fCompl0;
  _fCompl1_local = pCut1;
  pCut1_local = pCut0;
  pCut0_local = (Pf_Cut_t *)p;
  iVar2 = Abc_Lit2Var(*(uint *)&pCut0->field_0x10 & 0x3ffffff);
  pwVar4 = Vec_MemReadEntry(pVVar1,iVar2);
  t1 = *pwVar4;
  pVVar1 = *(Vec_Mem_t **)&pCut0_local->field_0x10;
  iVar2 = Abc_Lit2Var(*(uint *)&_fCompl1_local->field_0x10 & 0x3ffffff);
  pwVar4 = Vec_MemReadEntry(pVVar1,iVar2);
  local_58 = *pwVar4;
  iVar2 = Abc_LitIsCompl(*(uint *)&pCut1_local->field_0x10 & 0x3ffffff);
  if (iVar2 != pCutR_local._4_4_) {
    t1 = t1 ^ 0xffffffffffffffff;
  }
  iVar2 = Abc_LitIsCompl(*(uint *)&_fCompl1_local->field_0x10 & 0x3ffffff);
  if (iVar2 != (int)pCutR_local) {
    local_58 = local_58 ^ 0xffffffffffffffff;
  }
  wVar5 = Abc_Tt6Expand(t1,pCut1_local->pLeaves,*(uint *)&pCut1_local->field_0x10 >> 0x1b,
                        _truthId->pLeaves,*(uint *)&_truthId->field_0x10 >> 0x1b);
  wVar6 = Abc_Tt6Expand(local_58,_fCompl1_local->pLeaves,
                        *(uint *)&_fCompl1_local->field_0x10 >> 0x1b,_truthId->pLeaves,
                        *(uint *)&_truthId->field_0x10 >> 0x1b);
  if (fIsXor == 0) {
    local_70 = wVar5 & wVar6;
  }
  else {
    local_70 = wVar5 ^ wVar6;
  }
  t0 = local_70;
  t._4_4_ = (uint)local_70 & 1;
  if ((local_70 & 1) != 0) {
    t0 = local_70 ^ 0xffffffffffffffff;
  }
  iVar2 = Abc_Tt6MinBase(&t0,_truthId->pLeaves,*(uint *)&_truthId->field_0x10 >> 0x1b);
  *(uint *)&_truthId->field_0x10 = *(uint *)&_truthId->field_0x10 & 0x7ffffff | iVar2 << 0x1b;
  if ((t0 & 1) == 0) {
    local_38 = Vec_MemHashInsert(*(Vec_Mem_t **)&pCut0_local->field_0x10,&t0);
    uVar3 = Abc_Var2Lit(local_38,t._4_4_);
    *(uint *)&_truthId->field_0x10 = *(uint *)&_truthId->field_0x10 & 0xfc000000 | uVar3 & 0x3ffffff
    ;
    uVar3 = Pf_ObjCutUseless((Pf_Man_t *)pCut0_local,local_38);
    *(uint *)&_truthId->field_0x10 =
         *(uint *)&_truthId->field_0x10 & 0xfbffffff | (uVar3 & 1) << 0x1a;
    if ((int)(*(uint *)&_truthId->field_0x10 >> 0x1b) <= fCompl) {
      return (int)((int)(*(uint *)&_truthId->field_0x10 >> 0x1b) < fCompl);
    }
    __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaPf.c"
                  ,0x17f,
                  "int Pf_CutComputeTruth6(Pf_Man_t *, Pf_Cut_t *, Pf_Cut_t *, int, int, Pf_Cut_t *, int)"
                 );
  }
  __assert_fail("(int)(t & 1) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaPf.c"
                ,0x17b,
                "int Pf_CutComputeTruth6(Pf_Man_t *, Pf_Cut_t *, Pf_Cut_t *, int, int, Pf_Cut_t *, int)"
               );
}

Assistant:

static inline int Pf_CutComputeTruth6( Pf_Man_t * p, Pf_Cut_t * pCut0, Pf_Cut_t * pCut1, int fCompl0, int fCompl1, Pf_Cut_t * pCutR, int fIsXor )
{
//    extern int Pf_ManTruthCanonicize( word * t, int nVars );
    int nOldSupp = pCutR->nLeaves, truthId, fCompl; word t;
    word t0 = *Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(pCut0->iFunc));
    word t1 = *Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(pCut1->iFunc));
    if ( Abc_LitIsCompl(pCut0->iFunc) ^ fCompl0 ) t0 = ~t0;
    if ( Abc_LitIsCompl(pCut1->iFunc) ^ fCompl1 ) t1 = ~t1;
    t0 = Abc_Tt6Expand( t0, pCut0->pLeaves, pCut0->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    t1 = Abc_Tt6Expand( t1, pCut1->pLeaves, pCut1->nLeaves, pCutR->pLeaves, pCutR->nLeaves );
    t =  fIsXor ? t0 ^ t1 : t0 & t1;
    if ( (fCompl = (int)(t & 1)) ) t = ~t;
    pCutR->nLeaves = Abc_Tt6MinBase( &t, pCutR->pLeaves, pCutR->nLeaves );
    assert( (int)(t & 1) == 0 );
    truthId        = Vec_MemHashInsert(p->vTtMem, &t);
    pCutR->iFunc   = Abc_Var2Lit( truthId, fCompl );
    pCutR->Useless = Pf_ObjCutUseless( p, truthId );
    assert( (int)pCutR->nLeaves <= nOldSupp );
    return (int)pCutR->nLeaves < nOldSupp;
}